

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LoopLayerParams::LoopLayerParams(LoopLayerParams *this,LoopLayerParams *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  NeuralNetwork *pNVar2;
  NeuralNetwork *pNVar3;
  undefined8 *puVar4;
  ulong uVar5;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LoopLayerParams_00487a78;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar5 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,(string *)((uVar5 & 0xfffffffffffffffc) + 8));
  }
  (this->conditionvar_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar5 = (ulong)(from->conditionvar_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = this_00->ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->conditionvar_,uVar5,puVar4);
  }
  pNVar2 = from->conditionnetwork_;
  if (pNVar2 == (NeuralNetwork *)0x0 ||
      from == (LoopLayerParams *)_LoopLayerParams_default_instance_) {
    pNVar3 = (NeuralNetwork *)0x0;
  }
  else {
    pNVar3 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar3,pNVar2);
  }
  this->conditionnetwork_ = pNVar3;
  pNVar2 = from->bodynetwork_;
  if (pNVar2 == (NeuralNetwork *)0x0 ||
      from == (LoopLayerParams *)_LoopLayerParams_default_instance_) {
    pNVar3 = (NeuralNetwork *)0x0;
  }
  else {
    pNVar3 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar3,pNVar2);
  }
  this->bodynetwork_ = pNVar3;
  this->maxloopiterations_ = from->maxloopiterations_;
  return;
}

Assistant:

LoopLayerParams::LoopLayerParams(const LoopLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  conditionvar_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    conditionvar_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_conditionvar().empty()) {
    conditionvar_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_conditionvar(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_conditionnetwork()) {
    conditionnetwork_ = new ::CoreML::Specification::NeuralNetwork(*from.conditionnetwork_);
  } else {
    conditionnetwork_ = nullptr;
  }
  if (from._internal_has_bodynetwork()) {
    bodynetwork_ = new ::CoreML::Specification::NeuralNetwork(*from.bodynetwork_);
  } else {
    bodynetwork_ = nullptr;
  }
  maxloopiterations_ = from.maxloopiterations_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LoopLayerParams)
}